

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall Matrix::lu(Matrix *this,int32_t *idx,FLOAT *d,FLOAT eps)

{
  uint uVar1;
  FLOAT **ppFVar2;
  FLOAT *pFVar3;
  FLOAT *pFVar4;
  void *__ptr;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  size_t __size;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  FLOAT FVar13;
  double dVar14;
  double dVar15;
  
  uVar1 = this->n;
  if (this->m != uVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "ERROR: Trying to LU decompose a matrix of size (");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->m);
    poVar5 = std::operator<<(poVar5,"x");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->n);
    poVar5 = std::operator<<(poVar5,")");
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(0);
  }
  __size = (long)(int)uVar1 * 8;
  __ptr = malloc(__size);
  *d = 1.0;
  bVar12 = (int)uVar1 < 1;
  if (0 < (int)uVar1) {
    ppFVar2 = this->val;
    uVar6 = 0;
    do {
      __size = 0;
      dVar14 = 0.0;
      do {
        dVar15 = ABS(ppFVar2[uVar6][__size]);
        if (ABS(ppFVar2[uVar6][__size]) <= dVar14) {
          dVar15 = dVar14;
        }
        __size = __size + 1;
        dVar14 = dVar15;
      } while (uVar1 != __size);
      if ((dVar15 == 0.0) && (!NAN(dVar15))) goto LAB_00103fc1;
      *(double *)((long)__ptr + uVar6 * 8) = 1.0 / dVar15;
      uVar6 = uVar6 + 1;
      bVar12 = (ulong)(long)(int)uVar1 <= uVar6;
    } while (uVar6 != uVar1);
  }
  uVar6 = (ulong)(uint)this->n;
  if (0 < this->n) {
    ppFVar2 = this->val;
    uVar7 = 1;
    uVar8 = 0;
    do {
      if (uVar8 != 0) {
        uVar10 = 0;
        do {
          pFVar3 = ppFVar2[uVar10];
          FVar13 = pFVar3[uVar8];
          if (uVar10 != 0) {
            uVar11 = 0;
            do {
              FVar13 = FVar13 - pFVar3[uVar11] * ppFVar2[uVar11][uVar8];
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          pFVar3[uVar8] = FVar13;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar8);
      }
      if ((long)uVar8 < (long)(int)uVar6) {
        dVar14 = 0.0;
        uVar10 = uVar8;
        do {
          pFVar3 = ppFVar2[uVar10];
          FVar13 = pFVar3[uVar8];
          if (uVar8 != 0) {
            uVar11 = 0;
            do {
              FVar13 = FVar13 - pFVar3[uVar11] * ppFVar2[uVar11][uVar8];
              uVar11 = uVar11 + 1;
            } while (uVar8 != uVar11);
          }
          pFVar3[uVar8] = FVar13;
          dVar15 = ABS(FVar13) * *(double *)((long)__ptr + uVar10 * 8);
          if (dVar14 <= dVar15) {
            __size = uVar10;
          }
          __size = __size & 0xffffffff;
          dVar14 = (double)(-(ulong)(dVar15 < dVar14) & (ulong)dVar14 |
                           ~-(ulong)(dVar15 < dVar14) & (ulong)dVar15);
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uVar6 & 0xffffffff));
      }
      iVar9 = (int)__size;
      if (uVar8 != (__size & 0xffffffff)) {
        if (0 < (int)uVar6) {
          pFVar3 = ppFVar2[iVar9];
          pFVar4 = ppFVar2[uVar8];
          uVar10 = 0;
          do {
            FVar13 = pFVar3[uVar10];
            pFVar3[uVar10] = pFVar4[uVar10];
            pFVar4[uVar10] = FVar13;
            uVar10 = uVar10 + 1;
          } while ((uVar6 & 0xffffffff) != uVar10);
        }
        *d = -*d;
        *(undefined8 *)((long)__ptr + (long)iVar9 * 8) = *(undefined8 *)((long)__ptr + uVar8 * 8);
      }
      idx[uVar8] = iVar9;
      uVar1 = this->n;
      if ((uVar8 != uVar1 - 1) && ((long)(uVar8 + 1) < (long)(int)uVar1)) {
        dVar14 = ppFVar2[uVar8][uVar8];
        uVar6 = uVar7;
        do {
          ppFVar2[uVar6][uVar8] = ppFVar2[uVar6][uVar8] * (1.0 / dVar14);
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      uVar8 = uVar8 + 1;
      uVar6 = (ulong)this->n;
      uVar7 = uVar7 + 1;
    } while ((long)uVar8 < (long)uVar6);
  }
LAB_00103fc1:
  free(__ptr);
  return bVar12;
}

Assistant:

bool Matrix::lu(int32_t *idx, FLOAT &d, FLOAT eps) {
  
  if (m != n) {
    cerr << "ERROR: Trying to LU decompose a matrix of size (" << m << "x" << n << ")" << endl;
    exit(0);
  }
  
  int32_t i,imax,j,k;
  FLOAT   big,dum,sum,temp;
  FLOAT* vv = (FLOAT*)malloc(n*sizeof(FLOAT)); // vv stores the implicit scaling of each row.
  d = 1.0;
  for (i=0; i<n; i++) { // Loop over rows to get the implicit scaling information.
    big = 0.0;
    for (j=0; j<n; j++)
      if ((temp=fabs(val[i][j]))>big)
        big = temp;
    if (big == 0.0) { // No nonzero largest element.
      free(vv);
      return false;
    }
    vv[i] = 1.0/big; // Save the scaling.
  }
  for (j=0; j<n; j++) { // This is the loop over columns of Crout’s method.
    for (i=0; i<j; i++) { // This is equation (2.3.12) except for i = j.
      sum = val[i][j];
      for (k=0; k<i; k++)
        sum -= val[i][k]*val[k][j];
      val[i][j] = sum;
    }
    big = 0.0; // Initialize the search for largest pivot element.
    for (i=j; i<n; i++) {
      sum = val[i][j];
      for (k=0; k<j; k++)
        sum -= val[i][k]*val[k][j];
      val[i][j] = sum;
      if ( (dum=vv[i]*fabs(sum))>=big) {
        big  = dum;
        imax = i;
      }
    }
    if (j!=imax) { // Do we need to interchange rows?
      for (k=0; k<n; k++) { // Yes, do so...
        dum          = val[imax][k];
        val[imax][k] = val[j][k];
        val[j][k]    = dum;
      }
      d = -d;     // ...and change the parity of d.
      vv[imax]=vv[j]; // Also interchange the scale factor.
    }
    idx[j] = imax;
    if (j!=n-1) { // Now, finally, divide by the pivot element.
      dum = 1.0/val[j][j];
      for (i=j+1; i<n; i++)
        val[i][j] *= dum;
    }
  } // Go back for the next column in the reduction.
  
  // success
  free(vv);
  return true;
}